

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map_test.cpp
# Opt level: O0

void __thiscall adt_map_test_map_structs_Test::TestBody(adt_map_test_map_structs_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  stru value1;
  AssertionResult gtest_ar_3;
  stru value0;
  AssertionResult gtest_ar_2;
  vector v;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  map m;
  stru b;
  stru a;
  unsigned_long *in_stack_fffffffffffffdb0;
  unsigned_long *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  bool local_221;
  bool local_209;
  bool local_1f1;
  bool local_1d9;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_158;
  uint local_154;
  AssertionResult local_150;
  AssertHelper local_140;
  Message local_138;
  undefined4 local_130;
  uint local_12c;
  AssertionResult local_128;
  AssertHelper local_118;
  Message local_110;
  undefined4 local_108;
  uint local_104;
  AssertionResult local_100;
  undefined8 *local_f0;
  AssertHelper local_e8;
  Message local_e0;
  undefined4 local_d8;
  uint local_d4;
  AssertionResult local_d0;
  undefined8 *local_c0;
  AssertHelper local_b8;
  Message local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  AssertionResult local_98;
  undefined8 local_88;
  AssertHelper local_80;
  Message local_78;
  undefined4 local_70;
  undefined4 local_6c;
  AssertionResult local_68;
  AssertHelper local_58;
  Message local_50 [3];
  undefined4 local_38;
  undefined4 local_34;
  AssertionResult local_30;
  undefined8 local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  
  local_10 = (undefined8 *)operator_new(0x10);
  *local_10 = 0;
  local_10[1] = 0;
  *local_10 = "random";
  *(undefined4 *)(local_10 + 1) = 0x7b;
  local_18 = (undefined8 *)operator_new(0x10);
  *(undefined4 *)local_18 = 0;
  *(undefined4 *)((long)local_18 + 4) = 0;
  *(undefined4 *)(local_18 + 1) = 0;
  *(undefined4 *)((long)local_18 + 0xc) = 0;
  *local_18 = "random";
  *(undefined4 *)(local_18 + 1) = 0x141;
  local_20 = map_create(hash_callback_str,comparable_callback_str);
  local_34 = 0;
  local_38 = map_insert(local_20,*local_10);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,(int *)in_stack_fffffffffffffdb8,
             (int *)in_stack_fffffffffffffdb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10dfb7);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_map_test/source/adt_map_test.cpp"
               ,0xc2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message((Message *)0x10e01a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e072);
  local_6c = 0;
  local_70 = map_insert(local_20,*local_18);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,(int *)in_stack_fffffffffffffdb8,
             (int *)in_stack_fffffffffffffdb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10e13e);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_map_test/source/adt_map_test.cpp"
               ,0xc3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message((Message *)0x10e1a1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e1f9);
  local_88 = map_get(local_20,"random");
  local_a0 = vector_size(local_88);
  local_a8 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             in_stack_fffffffffffffdb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10e2d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_map_test/source/adt_map_test.cpp"
               ,199,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message((Message *)0x10e33b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e393);
  local_c0 = (undefined8 *)vector_at(local_88,0);
  local_c0 = (undefined8 *)*local_c0;
  local_1d9 = true;
  if (*(int *)(local_c0 + 1) != 0x7b) {
    local_1d9 = *(int *)(local_c0 + 1) == 0x141;
  }
  local_d4 = (uint)local_1d9;
  local_d8 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,(int *)in_stack_fffffffffffffdb8,
             (int *)in_stack_fffffffffffffdb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10e490);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_map_test/source/adt_map_test.cpp"
               ,0xcb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message((Message *)0x10e4ed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e545);
  local_f0 = (undefined8 *)vector_at(local_88,1);
  local_f0 = (undefined8 *)*local_f0;
  local_1f1 = true;
  if (*(int *)(local_f0 + 1) != 0x7b) {
    local_1f1 = *(int *)(local_f0 + 1) == 0x141;
  }
  local_104 = (uint)local_1f1;
  local_108 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,(int *)in_stack_fffffffffffffdb8,
             (int *)in_stack_fffffffffffffdb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10e643);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_map_test/source/adt_map_test.cpp"
               ,0xcf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message((Message *)0x10e6a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e6f8);
  local_209 = local_10 == local_c0 || local_10 == local_f0;
  local_12c = (uint)local_209;
  local_130 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,(int *)in_stack_fffffffffffffdb8,
             (int *)in_stack_fffffffffffffdb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10e7d9);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_map_test/source/adt_map_test.cpp"
               ,0xd1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message((Message *)0x10e836);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e88e);
  local_221 = local_18 == local_c0 || local_18 == local_f0;
  local_154 = (uint)local_221;
  local_158 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,(int *)in_stack_fffffffffffffdb8,
             (int *)in_stack_fffffffffffffdb0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10e96f);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_map_test/source/adt_map_test.cpp"
               ,0xd2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message((Message *)0x10e9cc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ea24);
  log_write_impl_va("metacall",0xd4,"TestBody",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_map_test/source/adt_map_test.cpp"
                    ,0,"A-B %p | %p",local_10,local_18);
  log_write_impl_va("metacall",0xd5,"TestBody",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_map_test/source/adt_map_test.cpp"
                    ,0,"val %p | %p",local_c0,local_f0);
  vector_destroy(local_88);
  map_destroy(local_20);
  if (local_10 != (undefined8 *)0x0) {
    operator_delete(local_10);
  }
  if (local_18 != (undefined8 *)0x0) {
    operator_delete(local_18);
  }
  return;
}

Assistant:

TEST_F(adt_map_test, map_structs)
{
	typedef struct stru_type
	{
		const char *str;
		int a;
	} * stru;

	static const char k[] = "random";

	stru a = new stru_type();
	a->str = k;
	a->a = 123;

	stru b = new stru_type();
	b->str = k;
	b->a = 321;

	map m = map_create(&hash_callback_str, &comparable_callback_str);

	EXPECT_EQ((int)0, (int)map_insert(m, (map_key)a->str, a));
	EXPECT_EQ((int)0, (int)map_insert(m, (map_key)b->str, b));

	vector v = map_get(m, (map_key)k);

	EXPECT_EQ((size_t)vector_size(v), (size_t)2);

	stru value0 = vector_at_type(v, 0, stru);

	EXPECT_EQ((int)(123 == value0->a || 321 == value0->a), (int)1);

	stru value1 = vector_at_type(v, 1, stru);

	EXPECT_EQ((int)(123 == value1->a || 321 == value1->a), (int)1);

	EXPECT_EQ((int)(a == value0 || a == value1), (int)1);
	EXPECT_EQ((int)(b == value0 || b == value1), (int)1);

	log_write("metacall", LOG_LEVEL_DEBUG, "A-B %p | %p", a, b);
	log_write("metacall", LOG_LEVEL_DEBUG, "val %p | %p", value0, value1);

	vector_destroy(v);

	map_destroy(m);

	delete a;
	delete b;
}